

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O0

uint8_t * bcf_unpack_fmt_core1(uint8_t *ptr,int n_sample,bcf_fmt_t *fmt)

{
  int32_t iVar1;
  uint8_t *ptr_start;
  bcf_fmt_t *fmt_local;
  uint8_t *puStack_10;
  int n_sample_local;
  uint8_t *ptr_local;
  
  puStack_10 = ptr;
  iVar1 = bcf_dec_typed_int1(ptr,&stack0xfffffffffffffff0);
  fmt->id = iVar1;
  iVar1 = bcf_dec_size(puStack_10,&stack0xfffffffffffffff0,&fmt->type);
  fmt->n = iVar1;
  fmt->size = fmt->n << (bcf_type_shift[fmt->type] & 0x1f);
  fmt->p = puStack_10;
  *(uint *)&fmt->field_0x1c =
       *(uint *)&fmt->field_0x1c & 0x80000000 | (int)puStack_10 - (int)ptr & 0x7fffffffU;
  *(uint *)&fmt->field_0x1c = *(uint *)&fmt->field_0x1c & 0x7fffffff;
  fmt->p_len = (int)(puStack_10 + n_sample * fmt->size) - (int)fmt->p;
  return puStack_10 + n_sample * fmt->size;
}

Assistant:

static inline uint8_t *bcf_unpack_fmt_core1(uint8_t *ptr, int n_sample, bcf_fmt_t *fmt)
{
    uint8_t *ptr_start = ptr;
    fmt->id = bcf_dec_typed_int1(ptr, &ptr);
    fmt->n = bcf_dec_size(ptr, &ptr, &fmt->type);
    fmt->size = fmt->n << bcf_type_shift[fmt->type];
    fmt->p = ptr;
    fmt->p_off  = ptr - ptr_start;
    fmt->p_free = 0;
    ptr += n_sample * fmt->size;
    fmt->p_len = ptr - fmt->p;
    return ptr;
}